

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcUtil.c
# Opt level: O0

void Abc_NtkFixCoDriverProblem(Abc_Obj_t *pDriver,Abc_Obj_t *pNodeCo,int fDuplicate)

{
  Abc_Ntk_t *pNtk_00;
  int iVar1;
  Abc_Obj_t *pFanin_00;
  int local_3c;
  int k;
  Abc_Obj_t *pFanin;
  Abc_Obj_t *pDriverNew;
  Abc_Ntk_t *pNtk;
  int fDuplicate_local;
  Abc_Obj_t *pNodeCo_local;
  Abc_Obj_t *pDriver_local;
  
  pNtk_00 = pDriver->pNtk;
  if ((fDuplicate == 0) || (iVar1 = Abc_ObjIsCi(pDriver), iVar1 != 0)) {
    iVar1 = Abc_ObjFaninC0(pNodeCo);
    if (iVar1 == 0) {
      pFanin = Abc_NtkCreateNodeBuf(pNtk_00,pDriver);
    }
    else {
      pFanin = Abc_NtkCreateNodeInv(pNtk_00,pDriver);
      Abc_ObjXorFaninC(pNodeCo,0);
    }
  }
  else {
    pFanin = Abc_NtkDupObj(pNtk_00,pDriver,0);
    for (local_3c = 0; iVar1 = Abc_ObjFaninNum(pDriver), local_3c < iVar1; local_3c = local_3c + 1)
    {
      pFanin_00 = Abc_ObjFanin(pDriver,local_3c);
      Abc_ObjAddFanin(pFanin,pFanin_00);
    }
    iVar1 = Abc_ObjFaninC0(pNodeCo);
    if (iVar1 != 0) {
      Abc_NodeComplement(pFanin);
      Abc_ObjXorFaninC(pNodeCo,0);
    }
  }
  Abc_ObjPatchFanin(pNodeCo,pDriver,pFanin);
  iVar1 = Abc_ObjFanoutNum(pFanin);
  if (iVar1 == 1) {
    iVar1 = Abc_ObjFanoutNum(pDriver);
    if (iVar1 == 0) {
      Abc_NtkDeleteObj(pDriver);
    }
    return;
  }
  __assert_fail("Abc_ObjFanoutNum(pDriverNew) == 1",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abc/abcUtil.c"
                ,899,"void Abc_NtkFixCoDriverProblem(Abc_Obj_t *, Abc_Obj_t *, int)");
}

Assistant:

void Abc_NtkFixCoDriverProblem( Abc_Obj_t * pDriver, Abc_Obj_t * pNodeCo, int fDuplicate )
{
    Abc_Ntk_t * pNtk = pDriver->pNtk;
    Abc_Obj_t * pDriverNew, * pFanin;
    int k;
    if ( fDuplicate && !Abc_ObjIsCi(pDriver) )
    {
        pDriverNew = Abc_NtkDupObj( pNtk, pDriver, 0 ); 
        Abc_ObjForEachFanin( pDriver, pFanin, k )
            Abc_ObjAddFanin( pDriverNew, pFanin );
        if ( Abc_ObjFaninC0(pNodeCo) )
        {
            // change polarity of the duplicated driver
            Abc_NodeComplement( pDriverNew );
            Abc_ObjXorFaninC( pNodeCo, 0 );
        }
    }
    else
    {
        // add inverters and buffers when necessary
        if ( Abc_ObjFaninC0(pNodeCo) )
        {
            pDriverNew = Abc_NtkCreateNodeInv( pNtk, pDriver );
            Abc_ObjXorFaninC( pNodeCo, 0 );
        }
        else
            pDriverNew = Abc_NtkCreateNodeBuf( pNtk, pDriver );        
    }
    // update the fanin of the PO node
    Abc_ObjPatchFanin( pNodeCo, pDriver, pDriverNew );
    assert( Abc_ObjFanoutNum(pDriverNew) == 1 );
    // remove the old driver if it dangles
    // (this happens when the duplicated driver had only one complemented fanout)
    if ( Abc_ObjFanoutNum(pDriver) == 0 )
        Abc_NtkDeleteObj( pDriver );
}